

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funzip.cpp
# Opt level: O0

void __thiscall FUnzip::exec(FUnzip *this)

{
  pointer *this_00;
  __pthread_internal_list **this_01;
  int iVar1;
  bool bVar2;
  funzip_exception *this_02;
  size_type sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  reference piVar6;
  Entry *__rhs;
  char *pcVar7;
  string asStack_10390 [32];
  undefined8 uStack_10370;
  size_type l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name_1;
  LocalEntry le_1;
  Entry *e_2;
  iterator iStack_10318;
  int i_1;
  iterator __end1_3;
  iterator __begin1_3;
  vector<int,_std::allocator<int>_> *__range1_3;
  path pStack_102c0;
  undefined1 auStack_10280 [8];
  string fname;
  string dname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  int64_t uncompSize;
  LocalEntry le;
  Entry *e_1;
  iterator iStack_101e8;
  int i;
  iterator __end1_2;
  iterator __begin1_2;
  vector<int,_std::allocator<int>_> *__range1_2;
  File f;
  int gid;
  int uid;
  char linkName [65536];
  thread *t_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1_1;
  atomic<int> *local_190;
  pointer *local_188;
  pointer *local_180;
  vector<int,_std::allocator<int>_> *local_178;
  undefined1 local_170 [24];
  string local_158 [32];
  thread local_138;
  reference local_130;
  thread *t;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  undefined1 local_108 [8];
  vector<std::thread,_std::allocator<std::thread>_> workerThreads;
  mutex lm;
  vector<int,_std::allocator<int>_> dirs;
  vector<int,_std::allocator<int>_> links;
  Entry *e;
  iterator __end2;
  iterator __begin2;
  ZipStream *__range2;
  undefined1 local_68 [8];
  ZipStream zs;
  atomic<int> entryNum;
  FUnzip *this_local;
  
  zs.f_.fp_._4_4_ = 0;
  ZipStream::ZipStream((ZipStream *)local_68,&this->zipName);
  bVar2 = ZipStream::valid((ZipStream *)local_68);
  if (bVar2) {
    sVar3 = ZipStream::size((ZipStream *)local_68);
    if (sVar3 != 0) {
      if ((this->listFiles & 1U) == 0) {
        bVar2 = std::operator==(&this->destinationDir,"");
        if (bVar2) {
          smartDestDir(this,(ZipStream *)local_68);
        }
        bVar2 = std::operator!=(&this->destinationDir,"");
        if (bVar2) {
          std::__cxx11::string::size();
          pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)&this->destinationDir);
          if (*pcVar7 != '/') {
            std::__cxx11::string::operator+=((string *)&this->destinationDir,"/");
          }
        }
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)
                   &dirs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)
                   &lm.super___mutex_base._M_mutex.__data.__list.__next);
        std::mutex::mutex((mutex *)&workerThreads.
                                    super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        iVar1 = this->threadCount;
        std::allocator<std::thread>::allocator((allocator<std::thread> *)((long)&__range1 + 7));
        std::vector<std::thread,_std::allocator<std::thread>_>::vector
                  ((vector<std::thread,_std::allocator<std::thread>_> *)local_108,(long)iVar1,
                   (allocator<std::thread> *)((long)&__range1 + 7));
        std::allocator<std::thread>::~allocator((allocator<std::thread> *)((long)&__range1 + 7));
        __end1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                           ((vector<std::thread,_std::allocator<std::thread>_> *)local_108);
        t = (thread *)
            std::vector<std::thread,_std::allocator<std::thread>_>::end
                      ((vector<std::thread,_std::allocator<std::thread>_> *)local_108);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end1,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                           *)&t), bVar2) {
          local_130 = __gnu_cxx::
                      __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                      ::operator*(&__end1);
          __range1_1 = (vector<std::thread,_std::allocator<std::thread>_> *)local_68;
          local_190 = (atomic<int> *)((long)&zs.f_.fp_ + 4);
          local_188 = &workerThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
          local_180 = &dirs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
          local_178 = (vector<int,_std::allocator<int>_> *)
                      ((long)&lm.super___mutex_base._M_mutex + 0x20);
          ZipStream::dupFile((ZipStream *)local_170);
          local_170[0x10] = (bool)(this->verbose & 1);
          std::__cxx11::string::string(local_158,(string *)&this->destinationDir);
          std::thread::thread<FUnzip::exec()::__0,,void>(&local_138,(type *)&__range1_1);
          std::thread::operator=(local_130,&local_138);
          std::thread::~thread(&local_138);
          exec()::$_0::~__0((__0 *)&__range1_1);
          __gnu_cxx::
          __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
          ::operator++(&__end1);
        }
        __end1_1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                             ((vector<std::thread,_std::allocator<std::thread>_> *)local_108);
        t_1 = (thread *)
              std::vector<std::thread,_std::allocator<std::thread>_>::end
                        ((vector<std::thread,_std::allocator<std::thread>_> *)local_108);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end1_1,
                                  (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                   *)&t_1), bVar2) {
          __gnu_cxx::
          __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
          ::operator*(&__end1_1);
          std::thread::join();
          __gnu_cxx::
          __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
          ::operator++(&__end1_1);
        }
        ZipStream::dupFile((ZipStream *)&__range1_2);
        this_00 = &dirs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        __end1_2 = std::vector<int,_std::allocator<int>_>::begin
                             ((vector<int,_std::allocator<int>_> *)this_00);
        iStack_101e8 = std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)this_00);
        while (bVar2 = __gnu_cxx::operator!=(&__end1_2,&stack0xfffffffffffefe18), bVar2) {
          piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&__end1_2);
          le._22_8_ = ZipStream::getEntry((ZipStream *)local_68,*piVar6);
          File::seek((File *)&__range1_2,((Entry *)le._22_8_)->offset,0);
          File::Read<LocalEntry>((LocalEntry *)((long)&uncompSize + 2),(File *)&__range1_2);
          File::seek((File *)&__range1_2,(ulong)(ushort)le.compSize,1);
          f.fp_._0_4_ = -1;
          f.fp_._4_4_ = -1;
          name.field_2._8_8_ = ZEXT48(le.crc);
          readExtra((File *)&__range1_2,(uint)le.compSize._2_2_,(int *)((long)&f.fp_ + 4),
                    (int *)&f.fp_,(int64_t *)0x0,(int64_t *)(name.field_2._M_local_buf + 8));
          File::Read<char>((File *)&__range1_2,(char *)&gid,name.field_2._8_8_);
          *(undefined1 *)((long)&gid + name.field_2._8_8_) = 0;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&dname.field_2 + 8),&this->destinationDir,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         le._22_8_);
          path_directory((string *)((long)&fname.field_2 + 8),(string *)((long)&dname.field_2 + 8));
          path_filename((string *)auStack_10280,(string *)le._22_8_);
          if ((this->verbose & 1U) != 0) {
            uVar4 = std::__cxx11::string::c_str();
            uVar5 = std::__cxx11::string::c_str();
            printf("Link %s/%s -> %s\n",uVar4,uVar5,&gid);
          }
          std::experimental::filesystem::v1::__cxx11::path::
          path<char[65536],std::experimental::filesystem::v1::__cxx11::path>
                    (&pStack_102c0,(char (*) [65536])&gid);
          std::experimental::filesystem::v1::__cxx11::path::
          path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
                    ((path *)&__range1_3,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_10280);
          std::experimental::filesystem::v1::create_symlink(&pStack_102c0,(path *)&__range1_3);
          std::experimental::filesystem::v1::__cxx11::path::~path((path *)&__range1_3);
          std::experimental::filesystem::v1::__cxx11::path::~path(&pStack_102c0);
          setMeta((string *)((long)&dname.field_2 + 8),*(uint16_t *)(le._22_8_ + 0x28),le._2_4_,
                  f.fp_._4_4_,(int)f.fp_,true);
          std::__cxx11::string::~string((string *)auStack_10280);
          std::__cxx11::string::~string((string *)(fname.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(dname.field_2._M_local_buf + 8));
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end1_2);
        }
        this_01 = &lm.super___mutex_base._M_mutex.__data.__list.__next;
        __end1_3 = std::vector<int,_std::allocator<int>_>::begin
                             ((vector<int,_std::allocator<int>_> *)this_01);
        iStack_10318 = std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)this_01);
        while (bVar2 = __gnu_cxx::operator!=(&__end1_3,&stack0xfffffffffffefce8), bVar2) {
          piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&__end1_3);
          __rhs = ZipStream::getEntry((ZipStream *)local_68,*piVar6);
          File::seek((File *)&__range1_2,__rhs->offset,0);
          File::Read<LocalEntry>((LocalEntry *)((long)&name_1.field_2 + 10),(File *)&__range1_2);
          File::seek((File *)&__range1_2,(ulong)(ushort)le_1.compSize,1);
          f.fp_._0_4_ = -1;
          f.fp_._4_4_ = -1;
          readExtra((File *)&__range1_2,(uint)le_1.compSize._2_2_,(int *)((long)&f.fp_ + 4),
                    (int *)&f.fp_,(int64_t *)0x0,(int64_t *)0x0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&l,
                         &this->destinationDir,&__rhs->name);
          uStack_10370 = std::__cxx11::string::length();
          pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)&l);
          if (*pcVar7 == '/') {
            std::__cxx11::string::substr((ulong)asStack_10390,(ulong)&l);
            std::__cxx11::string::operator=((string *)&l,asStack_10390);
            std::__cxx11::string::~string(asStack_10390);
          }
          setMeta((string *)&l,__rhs->flags,le_1._2_4_,f.fp_._4_4_,(int)f.fp_,false);
          std::__cxx11::string::~string((string *)&l);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end1_3);
        }
        pcVar7 = ZipStream::comment((ZipStream *)local_68);
        if (pcVar7 != (char *)0x0) {
          pcVar7 = ZipStream::comment((ZipStream *)local_68);
          puts(pcVar7);
        }
        File::~File((File *)&__range1_2);
        std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                  ((vector<std::thread,_std::allocator<std::thread>_> *)local_108);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   &lm.super___mutex_base._M_mutex.__data.__list.__next);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   &dirs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      else {
        __end2 = ZipStream::begin((ZipStream *)local_68);
        e = (Entry *)ZipStream::end((ZipStream *)local_68);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<ZipStream::Entry_*,_std::vector<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>_>
                                           *)&e), bVar2) {
          __gnu_cxx::
          __normal_iterator<ZipStream::Entry_*,_std::vector<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>_>
          ::operator*(&__end2);
          uVar4 = std::__cxx11::string::c_str();
          printf("%s\n",uVar4);
          __gnu_cxx::
          __normal_iterator<ZipStream::Entry_*,_std::vector<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>_>
          ::operator++(&__end2);
        }
      }
    }
    ZipStream::~ZipStream((ZipStream *)local_68);
    return;
  }
  this_02 = (funzip_exception *)__cxa_allocate_exception(0x10);
  funzip_exception::funzip_exception(this_02,"Not a zip file");
  __cxa_throw(this_02,&funzip_exception::typeinfo,funzip_exception::~funzip_exception);
}

Assistant:

void FUnzip::exec()
{
    std::atomic<int> entryNum(0);
    ZipStream zs{zipName};
    if (!zs.valid())
        throw funzip_exception("Not a zip file");

    if (zs.size() == 0)
        return;

    if (listFiles) {
        for (auto const& e : zs) {
            printf("%s\n", e.name.c_str());
        }
        return;
    }

    if (destinationDir == "")
        smartDestDir(zs);
    if (destinationDir != "" &&
        destinationDir[destinationDir.size() - 1] != '/')
        destinationDir += "/";

    std::vector<int> links;
    std::vector<int> dirs;
    std::mutex lm;

    std::vector<std::thread> workerThreads(threadCount);

    for (auto& t : workerThreads) {
        t = std::thread([&zs, &entryNum, &lm, &links, &dirs, f = zs.dupFile(),
                         verbose = verbose,
                         destDir = destinationDir]() mutable {
            while (true) {
                unsigned en = entryNum++;
                if (en >= zs.size())
                    break;
                auto& e = zs.getEntry(en);
                if ((e.flags & S_IFLNK) == S_IFLNK) {
                    std::lock_guard<std::mutex> lock(lm);
                    links.push_back(en);
                    continue;
                }

                if ((e.flags & S_IFDIR) == S_IFDIR ||
                    e.name[e.name.length() - 1] == '/') {
                    std::lock_guard<std::mutex> lock(lm);
                    dirs.push_back(en);
                    if (!fileExists(e.name))
                        makedirs(e.name);
                    continue;
                }

                f.seek(e.offset);
                auto le = f.Read<LocalEntry>();

                f.seek(le.nameLen, SEEK_CUR);
                int gid = -1;
                int uid = -1;
                int64_t uncompSize = le.uncompSize;
                int64_t compSize = le.compSize;
                // Read extra fields
                readExtra(f, le.exLen, &uid, &gid, &compSize, &uncompSize);
                auto name = destDir + e.name;
                auto dname = path_directory(name);
                if (dname != "" && !fileExists(dname))
                    makedirs(dname);

                if (verbose) {
                    printf("%s\n", name.c_str());
                    fflush(stdout);
                }
                // printf("%s %x %s %s\n", fileName, a, (a & S_IFDIR)  ==
                // S_IFDIR ? "DIR" : "", (a & S_IFLNK) == S_IFLNK ? "LINK" :
                // "");

                auto fout = File{name, File::Mode::WRITE};
                if (!fout.canWrite()) {
                    // char errstr[128];
                    // strerror_r(errno, errstr, sizeof(errstr));
                    // fprintf(stderr, "**Warning: Could not write '%s' (%s)\n",
                    // name.c_str(), errstr);
                    continue;
                }
                if (le.method == 0)
                    copyfile(fout, uncompSize, f);
                else
                    uncompress(fout, compSize, f);
                fout.close();
                setMeta(name, e.flags, le.dateTime, uid, gid);
            }
        });
    }
    for (auto& t : workerThreads)
        t.join();

    char linkName[65536];
    int uid, gid;
    auto f = zs.dupFile();
    for (int i : links) {
        auto& e = zs.getEntry(i);
        f.seek(e.offset);
        auto le = f.Read<LocalEntry>();

        f.seek(le.nameLen, SEEK_CUR);
        uid = gid = -1;
        int64_t uncompSize = le.uncompSize;
        readExtra(f, le.exLen, &uid, &gid, nullptr, &uncompSize);
        f.Read(linkName, uncompSize);
        linkName[uncompSize] = 0;
        auto name = destinationDir + e.name;
        auto dname = path_directory(name);
        auto fname = path_filename(e.name);
        // int fd = open(dname.c_str(), 0);
        if (verbose)
            printf("Link %s/%s -> %s\n", dname.c_str(), fname.c_str(),
                   linkName);
        fs::create_symlink(linkName, fname);
        // symlinkat(linkName, fd, fname.c_str());
        // close(fd);
        setMeta(name, e.flags, le.dateTime, uid, gid, true);
    }
    for (int i : dirs) {
        auto& e = zs.getEntry(i);
        f.seek(e.offset);
        auto le = f.Read<LocalEntry>();

        f.seek(le.nameLen, SEEK_CUR);
        uid = gid = -1;
        readExtra(f, le.exLen, &uid, &gid);
        auto name = destinationDir + e.name;
        auto l = name.length();
        if (name[l - 1] == '/')
            name = name.substr(0, l - 1);
        setMeta(name, e.flags, le.dateTime, uid, gid);
    }

    if (zs.comment())
        puts(zs.comment());
}